

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefSparse.cpp
# Opt level: O0

double __thiscall
JointBeliefSparse::UpdateSlow
          (JointBeliefSparse *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI,
          Index newJOI)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  const_reference pdVar4;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  long *in_RSI;
  long *in_RDI;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  BSit it_2;
  BScit it_1;
  BScit it;
  Index sI;
  bool isEventDriven;
  BS newJB_unnorm;
  size_t nrS;
  double Pso_ba;
  double Po_as;
  double Ps_ba;
  double Po_ba;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffdf8;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffe00;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *in_stack_fffffffffffffe08;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *pcVar14;
  const_iterator *in_stack_fffffffffffffe10;
  size_type in_stack_fffffffffffffe50;
  long *plVar15;
  size_type in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  iterator local_148 [3];
  char local_110 [32];
  const_iterator local_f0 [2];
  char local_d0 [32];
  const_iterator local_b0;
  uint local_a0;
  byte local_89;
  size_type local_40;
  double local_38;
  double local_30;
  double local_28;
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  *local_20;
  undefined4 local_18;
  undefined4 local_14;
  long *local_10;
  
  local_20 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)0x0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_40 = boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::size((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                     *)((long)in_RDI + *(long *)(*in_RDI + -0xd8) + 8));
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::compressed_vector((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                      in_stack_fffffffffffffe58,in_stack_fffffffffffffe50);
  local_89 = (**(code **)(*local_10 + 0x140))();
  local_89 = local_89 & 1;
  for (local_a0 = 0; local_a0 < local_40; local_a0 = local_a0 + 1) {
    local_38 = 0.0;
    if ((local_89 & 1) == 0) {
      local_28 = 0.0;
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::begin(in_stack_fffffffffffffdf8);
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::const_iterator::const_iterator
                ((const_iterator *)in_stack_fffffffffffffe00,(iterator *)in_stack_fffffffffffffdf8);
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::iterator::~iterator((iterator *)0x9c54a4);
      while( true ) {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::end(in_stack_fffffffffffffdf8);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::const_iterator
                  ((const_iterator *)in_stack_fffffffffffffe00,(iterator *)in_stack_fffffffffffffdf8
                  );
        pcVar3 = local_d0;
        bVar1 = boost::numeric::ublas::
                bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                              *)in_stack_fffffffffffffe00,
                             (derived_iterator_type *)in_stack_fffffffffffffdf8);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::~const_iterator((const_iterator *)0x9c550c);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::iterator::~iterator((iterator *)0x9c5519);
        plVar15 = local_10;
        if (!bVar1) break;
        pcVar3 = boost::numeric::ublas::
                 compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator::index(&local_b0,pcVar3,__c);
        uVar5 = (**(code **)(*plVar15 + 0x108))
                          (plVar15,(ulong)pcVar3 & 0xffffffff,local_14,local_a0);
        pdVar4 = boost::numeric::ublas::
                 compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator::operator*(in_stack_fffffffffffffe10);
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar5;
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *pdVar4;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = local_28;
        auVar9 = vfmadd213sd_fma(auVar8,auVar10,auVar12);
        local_28 = auVar9._0_8_;
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::operator++(&local_b0);
      }
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::const_iterator::~const_iterator((const_iterator *)0x9c5535);
      if (0.0 < local_28) {
        local_30 = (double)(**(code **)(*local_10 + 0x118))(local_10,local_14,local_a0,local_18);
        local_38 = local_30 * local_28;
      }
    }
    else {
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::begin(in_stack_fffffffffffffdf8);
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::const_iterator::const_iterator
                ((const_iterator *)in_stack_fffffffffffffe00,(iterator *)in_stack_fffffffffffffdf8);
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::iterator::~iterator((iterator *)0x9c5759);
      while( true ) {
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::end(in_stack_fffffffffffffdf8);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::const_iterator
                  ((const_iterator *)in_stack_fffffffffffffe00,(iterator *)in_stack_fffffffffffffdf8
                  );
        pcVar3 = local_110;
        bVar2 = boost::numeric::ublas::
                bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::const_iterator,_double>
                              *)in_stack_fffffffffffffe00,
                             (derived_iterator_type *)in_stack_fffffffffffffdf8);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::~const_iterator((const_iterator *)0x9c57be);
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::iterator::~iterator((iterator *)0x9c57cb);
        if ((bVar2 & 1) == 0) break;
        plVar15 = local_10;
        pcVar3 = boost::numeric::ublas::
                 compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator::index(local_f0,pcVar3,__c_00);
        pcVar3 = (char *)((ulong)pcVar3 & 0xffffffff);
        dVar6 = (double)(**(code **)(*plVar15 + 0x120))(plVar15,pcVar3,local_14,local_a0,local_18);
        plVar15 = local_10;
        pcVar3 = boost::numeric::ublas::
                 compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator::index(local_f0,pcVar3,__c_01);
        dVar7 = (double)(**(code **)(*plVar15 + 0x108))
                                  (plVar15,(ulong)pcVar3 & 0xffffffff,local_14,local_a0);
        pdVar4 = boost::numeric::ublas::
                 compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::const_iterator::operator*(in_stack_fffffffffffffe10);
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar6 * dVar7;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *pdVar4;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = local_38;
        auVar9 = vfmadd213sd_fma(auVar9,auVar11,auVar13);
        local_38 = auVar9._0_8_;
        boost::numeric::ublas::
        compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
        ::const_iterator::operator++(local_f0);
      }
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::const_iterator::~const_iterator((const_iterator *)0x9c57e4);
    }
    if (1e-12 < local_38) {
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::operator[](in_stack_fffffffffffffe08,(size_type)in_stack_fffffffffffffe00);
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::compressed_vector<double,0ul,boost::numeric::ublas::unbounded_array<unsigned_long,std::allocator<unsigned_long>>,boost::numeric::ublas::unbounded_array<double,std::allocator<double>>>>
      ::operator=((sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                   *)in_stack_fffffffffffffe00,(double *)in_stack_fffffffffffffdf8);
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      ::~sparse_vector_element
                ((sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                  *)0x9c59ee);
      local_20 = (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)(local_38 + (double)local_20);
    }
  }
  if (0.0 < (double)local_20) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::begin(in_stack_fffffffffffffdf8);
    while( true ) {
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::end(in_stack_fffffffffffffdf8);
      bVar1 = boost::numeric::ublas::
              bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::iterator,_double>
              ::operator!=((bidirectional_iterator_base<boost::numeric::ublas::sparse_bidirectional_iterator_tag,_boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>::iterator,_double>
                            *)in_stack_fffffffffffffe00,
                           (derived_iterator_type *)in_stack_fffffffffffffdf8);
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::iterator::~iterator((iterator *)0x9c5ab8);
      if (!bVar1) break;
      pcVar14 = local_20;
      in_stack_fffffffffffffe10 =
           (const_iterator *)
           boost::numeric::ublas::
           compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::iterator::operator*((iterator *)in_stack_fffffffffffffe10);
      (in_stack_fffffffffffffe10->
      super_container_const_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      ).c_ = (container_type *)
             ((double)(in_stack_fffffffffffffe10->
                      super_container_const_reference<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
                      ).c_ / (double)pcVar14);
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::iterator::operator++(local_148);
    }
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::iterator::~iterator((iterator *)0x9c5acd);
  }
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::operator=(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::~compressed_vector(local_20);
  return (double)local_20;
}

Assistant:

double JointBeliefSparse::UpdateSlow(const MultiAgentDecisionProcessDiscreteInterface &pu,
                                     Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    double Ps_ba, Po_as, Pso_ba;
    size_t nrS = _m_b.size();
    BS newJB_unnorm(nrS);
    bool isEventDriven = pu.GetEventObservability();
    for(Index sI=0; sI < nrS; sI++)
    {
        Pso_ba = 0;
        
        if(!isEventDriven)
        {
            //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
            Ps_ba = 0.0;

            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                Ps_ba += pu.GetTransitionProbability(it.index(), lastJAI, sI) * *it;
            
            if(Ps_ba>0) // if it is zero, Pso_ba will be zero anyway
            {
                //P(newJOI | lastJAI, sI) :
                Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
        }
        else
        {
            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                Pso_ba += pu.GetObservationProbability(it.index(), lastJAI, sI, newJOI) * 
                          pu.GetTransitionProbability(it.index(), lastJAI, sI) * *it;
        }
        
        if(Pso_ba>PROB_PRECISION) // we don't want to store very
                                  // small probabilities in a
                                  // sparse representation
        {
            newJB_unnorm[sI]=Pso_ba; //unnormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    
    //normalize:    
    if(Po_ba>0)
        for(BSit it=newJB_unnorm.begin(); it!=newJB_unnorm.end(); ++it)
            *it/=Po_ba;

    _m_b=newJB_unnorm;

#if JointBeliefSparse_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBeliefSparse::UpdateSlow SanityCheck failed"));
#endif

    return(Po_ba);
}